

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>
::_remove_last(Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>
               *this,Index lastIndex)

{
  const_iterator __it;
  __node_base_ptr p_Var1;
  mapped_type *pmVar2;
  node_ptr plVar3;
  invalid_argument *this_00;
  __node_base_ptr p_Var4;
  long lVar5;
  const_node_ptr p;
  node_ptr plVar6;
  ID_index pivot;
  uint local_2c;
  key_type local_28;
  uint local_24;
  
  p_Var1 = (this->matrix_)._M_h._M_buckets[(ulong)lastIndex % (this->matrix_)._M_h._M_bucket_count];
  for (p_Var4 = p_Var1->_M_nxt; *(Index *)&p_Var4[1]._M_nxt != lastIndex; p_Var4 = p_Var4->_M_nxt) {
    p_Var1 = p_Var4;
  }
  __it.
  super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
             )p_Var1->_M_nxt;
  local_2c = *(uint *)((long)__it.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                             ._M_cur + 0x24);
  if (*(key_type *)
       ((long)__it.
              super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
              ._M_cur + 0x28) != 0xffffffff) {
    local_28 = *(key_type *)
                ((long)__it.
                       super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_false>
                       ._M_cur + 0x28);
    pmVar2 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->matrix_,&local_28);
    (pmVar2->super_Chain_column_option).pairedColumn_ = 0xffffffff;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(this->pivotToColumnIndex_)._M_h,&local_2c);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(this->matrix_)._M_h,__it);
  local_24 = local_2c;
  plVar3 = (node_ptr)
           std::
           map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
           ::at((this->super_Matrix_row_access_option).rows_,&local_24);
  lVar5 = 1;
  plVar6 = plVar3;
  do {
    plVar6 = (((type *)&plVar6->next_)->data_).root_plus_size_.m_header.super_node.next_;
    lVar5 = lVar5 + -1;
  } while (plVar6 != plVar3);
  if (lVar5 == 0) {
    Matrix_row_access<boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_false>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>,_true,_unsigned_int>
    ::erase_empty_row(&this->super_Matrix_row_access_option,local_2c);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,
             "Chain_matrix::_remove_last - Column asked to be removed does not corresponds to a maximal simplex."
            );
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline void Chain_matrix<Master_matrix>::_remove_last(Index lastIndex)
{
  static_assert(Master_matrix::Option_list::has_removable_columns,
                "'_remove_last' is not implemented for the chosen options.");
  static_assert(Master_matrix::Option_list::has_map_column_container || !Master_matrix::Option_list::has_vine_update,
                "'_remove_last' is not implemented for the chosen options.");

  ID_index pivot;

  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    auto itToErase = matrix_.find(lastIndex);
    Column& colToErase = itToErase->second;
    pivot = colToErase.get_pivot();

    if constexpr (Master_matrix::Option_list::has_matrix_maximal_dimension_access) {
      Dim_opt::update_down(colToErase.get_dimension());
    }

    if (colToErase.is_paired()) matrix_.at(colToErase.get_paired_chain_index()).unassign_paired_chain();
    pivotToColumnIndex_.erase(pivot);
    matrix_.erase(itToErase);
  } else {
    GUDHI_CHECK(lastIndex == nextIndex_ - 1 && nextIndex_ == matrix_.size(),
                std::logic_error("Chain_matrix::_remove_last - Indexation problem."));

    Column& colToErase = matrix_[lastIndex];
    pivot = colToErase.get_pivot();

    if constexpr (Master_matrix::Option_list::has_matrix_maximal_dimension_access) {
      Dim_opt::update_down(colToErase.get_dimension());
    }

    if (colToErase.is_paired()) matrix_.at(colToErase.get_paired_chain_index()).unassign_paired_chain();
    pivotToColumnIndex_[pivot] = Master_matrix::template get_null_value<Index>();
    matrix_.pop_back();
    // TODO: resize matrix_ when a lot is removed? Could be not the best strategy if user inserts a lot back afterwards.
  }

  if constexpr (!Master_matrix::Option_list::has_vine_update) {
    --nextIndex_;  // should not be updated when there are vine updates, as possibly lastIndex != nextIndex - 1
  }

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    auto it = _indexToBar().find(--_nextPosition());
    typename Barcode::iterator bar = it->second;

    if (bar->death == Master_matrix::template get_null_value<Pos_index>())
      _barcode().erase(bar);
    else
      bar->death = Master_matrix::template get_null_value<Pos_index>();

    _indexToBar().erase(it);
    if constexpr (Master_matrix::Option_list::has_vine_update) Swap_opt::CP::pivotToPosition_.erase(pivot);
  }

  if constexpr (Master_matrix::Option_list::has_row_access) {
    GUDHI_CHECK(
        RA_opt::get_row(pivot).size() == 0,
        std::invalid_argument(
            "Chain_matrix::_remove_last - Column asked to be removed does not corresponds to a maximal simplex."));
    if constexpr (Master_matrix::Option_list::has_removable_rows) {
      RA_opt::erase_empty_row(pivot);
    }
  }
}